

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall embree::SceneGraph::Statistics::print(Statistics *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"  # transform nodes : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"    # objects       : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  # triangle meshes : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," ( ");
  poVar1 = std::ostream::_M_insert<double>
                     ((((double)CONCAT44(0x45300000,(int)(this->numTriangleBytes >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)this->numTriangleBytes) - 4503599627370496.0
                      )) * 1e-06);
  poVar1 = std::operator<<(poVar1," MB )");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"    # triangles     : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  # quad meshes     : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," ( ");
  poVar1 = std::ostream::_M_insert<double>
                     ((((double)CONCAT44(0x45300000,(int)(this->numQuadBytes >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)this->numQuadBytes) - 4503599627370496.0)) *
                      1e-06);
  poVar1 = std::operator<<(poVar1," MB )");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"    # quads         : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  # subdiv meshes   : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," ( ");
  poVar1 = std::ostream::_M_insert<double>
                     ((((double)CONCAT44(0x45300000,(int)(this->numSubdivBytes >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)this->numSubdivBytes) - 4503599627370496.0))
                      * 1e-06);
  poVar1 = std::operator<<(poVar1," MB )");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"    # patches       : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  # curve sets      : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," ( ");
  poVar1 = std::ostream::_M_insert<double>
                     ((((double)CONCAT44(0x45300000,(int)(this->numCurveBytes >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)this->numCurveBytes) - 4503599627370496.0))
                      * 1e-06);
  poVar1 = std::operator<<(poVar1," MB )");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"    # curves        : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  # grid meshes     : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," ( ");
  poVar1 = std::ostream::_M_insert<double>
                     ((((double)CONCAT44(0x45300000,(int)(this->numGridBytes >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)this->numGridBytes) - 4503599627370496.0)) *
                      1e-06);
  poVar1 = std::operator<<(poVar1," MB )");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"    # grids         : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  # point sets      : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," ( ");
  poVar1 = std::ostream::_M_insert<double>
                     ((((double)CONCAT44(0x45300000,(int)(this->numPointBytes >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)this->numPointBytes) - 4503599627370496.0))
                      * 1e-06);
  poVar1 = std::operator<<(poVar1," MB )");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"    # points        : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  # lights          : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  # cameras         : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  # materials       : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void SceneGraph::Statistics::print()
  {
    std::cout << "  # transform nodes : " << numTransformNodes << std::endl;
    std::cout << "    # objects       : " << numTransformedObjects << std::endl;
    std::cout << "  # triangle meshes : " << numTriangleMeshes << " ( " << 1E-6*numTriangleBytes << " MB )" << std::endl;
    std::cout << "    # triangles     : " << numTriangles << std::endl;
    std::cout << "  # quad meshes     : " << numQuadMeshes << " ( " << 1E-6*numQuadBytes << " MB )" << std::endl;
    std::cout << "    # quads         : " << numQuads << std::endl;
    std::cout << "  # subdiv meshes   : " << numSubdivMeshes << " ( " << 1E-6*numSubdivBytes << " MB )" << std::endl;
    std::cout << "    # patches       : " << numPatches << std::endl;
    std::cout << "  # curve sets      : " << numCurveSets << " ( " << 1E-6*numCurveBytes << " MB )" << std::endl;
    std::cout << "    # curves        : " << numCurves << std::endl;
    std::cout << "  # grid meshes     : " << numGridMeshNodes << " ( " << 1E-6*numGridBytes << " MB )" << std::endl;
    std::cout << "    # grids         : " << numGrids << std::endl;
    std::cout << "  # point sets      : " << numPointSets << " ( " << 1E-6*numPointBytes << " MB )" << std::endl;
    std::cout << "    # points        : " << numPoints << std::endl;
    std::cout << "  # lights          : " << numLights << std::endl;
    std::cout << "  # cameras         : " << numCameras << std::endl;
    std::cout << "  # materials       : " << numMaterials << std::endl;
  }